

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

bool __thiscall re2::Regexp::ParseState::DoLeftParen(ParseState *this,StringPiece *name)

{
  const_pointer pcVar1;
  size_type sVar2;
  int iVar3;
  Regexp *this_00;
  string *psVar4;
  
  this_00 = (Regexp *)operator_new(0x28);
  Regexp(this_00,kRegexpCharClass|kRegexpEmptyMatch,this->flags_);
  iVar3 = this->ncap_ + 1;
  this->ncap_ = iVar3;
  (this_00->field_7).field_0.max_ = iVar3;
  pcVar1 = name->data_;
  if (pcVar1 != (const_pointer)0x0) {
    psVar4 = (string *)operator_new(0x20);
    sVar2 = name->size_;
    *(string **)psVar4 = psVar4 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar4,pcVar1,pcVar1 + sVar2);
    (this_00->field_7).the_union_[1] = psVar4;
  }
  PushRegexp(this,this_00);
  return true;
}

Assistant:

bool Regexp::ParseState::DoLeftParen(const StringPiece& name) {
  Regexp* re = new Regexp(kLeftParen, flags_);
  re->cap_ = ++ncap_;
  if (name.data() != NULL)
    re->name_ = new std::string(name);
  return PushRegexp(re);
}